

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O3

string_view libtorrent::aux::integer_to_str(array<char,_21UL> *buf,integer_type val)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  char cVar5;
  size_t sVar6;
  long lVar7;
  byte bVar8;
  char *pcVar9;
  integer_type iVar10;
  ulong uVar11;
  string_view sVar12;
  
  if (-1 < val) {
    bVar8 = (byte)val;
    if ((ulong)val < 10) {
      buf->_M_elems[0] = bVar8 | 0x30;
      sVar6 = 1;
      goto LAB_001af2a3;
    }
    if ((ulong)val < 100) {
      bVar4 = (byte)(((uint)val & 0xff) / 10);
      buf->_M_elems[0] = bVar4 | 0x30;
      buf->_M_elems[1] = bVar8 + bVar4 * -10 | 0x30;
      sVar6 = 2;
      goto LAB_001af2a3;
    }
    if ((ulong)val < 1000) {
      uVar2 = (uint)val & 0xffff;
      buf->_M_elems[0] = (byte)(uVar2 / 100) | 0x30;
      uVar2 = uVar2 / 10;
      cVar5 = (char)uVar2;
      buf->_M_elems[1] = cVar5 + ((byte)((uVar2 & 0xff) / 5) & 0xfe) * -5 | 0x30;
      buf->_M_elems[2] = bVar8 + cVar5 * -10 | 0x30;
      sVar6 = 3;
      goto LAB_001af2a3;
    }
    if ((ulong)val < 10000) {
      uVar11 = val & 0xffff;
      buf->_M_elems[0] = (byte)((uint)(uVar11 >> 3) / 0x7d) | 0x30;
      uVar2 = (uint)(uVar11 >> 2) / 0x19;
      buf->_M_elems[1] = (char)uVar2 + ((byte)((uVar2 & 0xff) / 5) & 0xfe) * -5 | 0x30;
      uVar2 = (uint)uVar11 / 10;
      cVar5 = (char)uVar2;
      buf->_M_elems[2] = cVar5 + ((byte)(uVar2 / 5) & 0xfe) * -5 | 0x30;
      buf->_M_elems[3] = bVar8 + cVar5 * -10 | 0x30;
      sVar6 = 4;
      goto LAB_001af2a3;
    }
    if ((ulong)val < 100000) {
      uVar11 = val & 0xffffffff;
      buf->_M_elems[0] = (byte)(uVar11 / 10000) | 0x30;
      buf->_M_elems[1] =
           (char)(uVar11 / 1000) + ((byte)(((uint)(uVar11 / 1000) & 0xff) / 5) & 0xfe) * -5 | 0x30;
      buf->_M_elems[2] =
           (char)(uVar11 / 100) + ((byte)(((uint)(uVar11 / 100) & 0xffff) / 5) & 0xfe) * -5 | 0x30;
      buf->_M_elems[3] =
           (char)(uVar11 / 10) + ((byte)(((uint)(uVar11 / 10) & 0xffff) / 5) & 0xfe) * -5 | 0x30;
      buf->_M_elems[4] = bVar8 + (char)(uVar11 / 10) * -10 | 0x30;
      sVar6 = 5;
      goto LAB_001af2a3;
    }
  }
  iVar10 = -val;
  if (val < 1) {
    iVar10 = val;
  }
  lVar7 = 1;
  pcVar1 = buf[1]._M_elems + 1;
  do {
    pcVar9 = pcVar1;
    pcVar9[-2] = '0' - ((char)iVar10 + (char)(iVar10 / 10) * -10);
    uVar11 = iVar10 + 9;
    lVar7 = lVar7 + -1;
    pcVar1 = pcVar9 + -1;
    iVar10 = iVar10 / 10;
  } while (0x12 < uVar11);
  lVar3 = -1;
  if (val < 1) {
    pcVar9[-3] = 0x2d;
    lVar3 = -2;
  }
  buf = (array<char,_21UL> *)(pcVar9 + -1 + lVar3);
  sVar6 = -(lVar7 + lVar3);
LAB_001af2a3:
  sVar12._M_str = buf->_M_elems;
  sVar12._M_len = sVar6;
  return sVar12;
}

Assistant:

string_view integer_to_str(std::array<char, 21>& buf, entry::integer_type val)
	{
		if (val >= 0)
		{
			if (val < 10)
			{
				buf[0] = '0' + static_cast<char>(val);
				return {buf.data(), std::size_t(1)};
			}
			if (val < 100)
			{
				buf[0] = '0' + (val / 10) % 10;
				buf[1] = '0' + val % 10;
				return {buf.data(), std::size_t(2)};
			}
			if (val < 1000)
			{
				buf[0] = '0' + (val / 100) % 10;
				buf[1] = '0' + (val / 10) % 10;
				buf[2] = '0' + val % 10;
				return {buf.data(), std::size_t(3)};
			}
			if (val < 10000)
			{
				buf[0] = '0' + (val / 1000) % 10;
				buf[1] = '0' + (val / 100) % 10;
				buf[2] = '0' + (val / 10) % 10;
				buf[3] = '0' + val % 10;
				return {buf.data(), std::size_t(4)};
			}
			if (val < 100000)
			{
				buf[0] = '0' + (val / 10000) % 10;
				buf[1] = '0' + (val / 1000) % 10;
				buf[2] = '0' + (val / 100) % 10;
				buf[3] = '0' + (val / 10) % 10;
				buf[4] = '0' + val % 10;
				return {buf.data(), std::size_t(5)};
			}
		}
		// val == 0 is handled in the fast-path above
		TORRENT_ASSERT(val != 0);
		// slow path
		// convert positive values to negative, since the negative space is
		// larger, so we can fit INT64_MIN
		int sign = 1;
		if (val > 0)
		{
			sign = 0;
			val = -val;
		}
		char* ptr = &buf.back();
		do
		{
			*ptr-- = '0' - char(val % 10);
			val /= 10;
		} while (val != 0);
		if (sign) *ptr-- = '-';
		++ptr;
		return {ptr, static_cast<std::size_t>(&buf.back() - ptr + 1)};
	}